

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::PipelineStateGLImpl::ValidateShaderResources
          (PipelineStateGLImpl *this,shared_ptr<const_Diligent::ShaderResourcesGL> *pShaderResources
          ,char *ShaderName,SHADER_TYPE ShaderStages)

{
  element_type *this_00;
  anon_class_8_1_0a1f1cb4 HandleSB;
  anon_class_8_1_0a1f1cb4 HandleImage;
  anon_class_8_1_0a1f1cb4 HandleTexture;
  anon_class_8_1_0a1f1cb4 HandleUB;
  anon_class_24_3_205b5413 HandleResource;
  undefined1 auStack_20 [4];
  SHADER_TYPE ShaderStages_local;
  char *ShaderName_local;
  shared_ptr<const_Diligent::ShaderResourcesGL> *pShaderResources_local;
  PipelineStateGLImpl *this_local;
  
  HandleUB.HandleResource = (anon_class_24_3_205b5413 *)((long)&HandleResource.ShaderName + 4);
  HandleResource.this = (PipelineStateGLImpl *)auStack_20;
  HandleResource.ShaderStages = (SHADER_TYPE *)this;
  HandleResource.ShaderName._4_4_ = ShaderStages;
  _auStack_20 = (_func_int **)ShaderName;
  ShaderName_local = (char *)pShaderResources;
  pShaderResources_local = (shared_ptr<const_Diligent::ShaderResourcesGL> *)this;
  this_00 = std::
            __shared_ptr_access<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)pShaderResources);
  ShaderResourcesGL::
  ProcessConstResources<Diligent::PipelineStateGLImpl::ValidateShaderResources(std::shared_ptr<Diligent::ShaderResourcesGL_const>,char_const*,Diligent::SHADER_TYPE)::__0,Diligent::PipelineStateGLImpl::ValidateShaderResources(std::shared_ptr<Diligent::ShaderResourcesGL_const>,char_const*,Diligent::SHADER_TYPE)::__1,Diligent::PipelineStateGLImpl::ValidateShaderResources(std::shared_ptr<Diligent::ShaderResourcesGL_const>,char_const*,Diligent::SHADER_TYPE)::__2,Diligent::PipelineStateGLImpl::ValidateShaderResources(std::shared_ptr<Diligent::ShaderResourcesGL_const>,char_const*,Diligent::SHADER_TYPE)::__3>
            (this_00,(anon_class_24_3_205b5413 *)&HandleUB,(anon_class_24_3_205b5413 *)&HandleUB,
             (anon_class_24_3_205b5413 *)&HandleUB,(anon_class_24_3_205b5413 *)&HandleUB,
             (PipelineResourceLayoutDesc *)0x0,(SHADER_RESOURCE_VARIABLE_TYPE *)0x0,0);
  std::
  vector<std::shared_ptr<Diligent::ShaderResourcesGL_const>,std::allocator<std::shared_ptr<Diligent::ShaderResourcesGL_const>>>
  ::emplace_back<std::shared_ptr<Diligent::ShaderResourcesGL_const>>
            ((vector<std::shared_ptr<Diligent::ShaderResourcesGL_const>,std::allocator<std::shared_ptr<Diligent::ShaderResourcesGL_const>>>
              *)&this->m_ShaderResources,pShaderResources);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char_const*&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->m_ShaderNames,(char **)auStack_20);
  return;
}

Assistant:

void PipelineStateGLImpl::ValidateShaderResources(std::shared_ptr<const ShaderResourcesGL> pShaderResources, const char* ShaderName, SHADER_TYPE ShaderStages)
{
    const auto HandleResource = [&](const ShaderResourcesGL::GLResourceAttribs& Attribs,
                                    SHADER_RESOURCE_TYPE                        AltResourceType) //
    {
        const auto ResAttribution = GetResourceAttribution(Attribs.Name, ShaderStages);

#ifdef DILIGENT_DEVELOPMENT
        m_ResourceAttibutions.emplace_back(ResAttribution);
#endif

        if (!ResAttribution)
        {
            LOG_ERROR_AND_THROW("Shader '", ShaderName, "' contains resource '", Attribs.Name,
                                "' that is not present in any pipeline resource signature used to create pipeline state '",
                                m_Desc.Name, "'.");
        }

        const auto* const pSignature = ResAttribution.pSignature;
        VERIFY_EXPR(pSignature != nullptr);

        if (ResAttribution.ResourceIndex != ResourceAttribution::InvalidResourceIndex)
        {
            const auto& ResDesc = pSignature->GetResourceDesc(ResAttribution.ResourceIndex);

            // Shader reflection does not contain read-only flag, so image and storage buffer can be UAV or SRV.
            // Texture SRV is the same as input attachment.
            const auto Type = (AltResourceType == ResDesc.ResourceType ? AltResourceType : Attribs.ResourceType);

            ValidatePipelineResourceCompatibility(ResDesc, Type, Attribs.ResourceFlags, Attribs.ArraySize, ShaderName, pSignature->GetDesc().Name);
        }
        else
        {
            UNEXPECTED("Resource index should be valid");
        }
    };

    const auto HandleUB = [&](const ShaderResourcesGL::UniformBufferInfo& Attribs) {
        HandleResource(Attribs, Attribs.ResourceType);
    };

    const auto HandleTexture = [&](const ShaderResourcesGL::TextureInfo& Attribs) {
        const bool IsTexelBuffer = (Attribs.ResourceType != SHADER_RESOURCE_TYPE_TEXTURE_SRV);
        HandleResource(Attribs, IsTexelBuffer ? Attribs.ResourceType : SHADER_RESOURCE_TYPE_INPUT_ATTACHMENT);
    };

    const auto HandleImage = [&](const ShaderResourcesGL::ImageInfo& Attribs) {
        const bool IsImageBuffer = (Attribs.ResourceType != SHADER_RESOURCE_TYPE_TEXTURE_UAV);
        HandleResource(Attribs, IsImageBuffer ? SHADER_RESOURCE_TYPE_BUFFER_SRV : SHADER_RESOURCE_TYPE_TEXTURE_SRV);
    };

    const auto HandleSB = [&](const ShaderResourcesGL::StorageBlockInfo& Attribs) {
        HandleResource(Attribs, SHADER_RESOURCE_TYPE_BUFFER_SRV);
    };

    pShaderResources->ProcessConstResources(HandleUB, HandleTexture, HandleImage, HandleSB);

#ifdef DILIGENT_DEVELOPMENT
    m_ShaderResources.emplace_back(std::move(pShaderResources));
    m_ShaderNames.emplace_back(ShaderName);
#endif
}